

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FState * __thiscall PClassActor::FindState(PClassActor *this,int numnames,FName *names,bool exact)

{
  bool bVar1;
  undefined8 in_RAX;
  FStateLabel *pFVar2;
  FState *pFVar3;
  FStateLabels *this_00;
  FState *pFVar4;
  long lVar5;
  undefined8 uStack_38;
  
  this_00 = this->StateList;
  if (this_00 == (FStateLabels *)0x0) {
    return (FState *)0x0;
  }
  lVar5 = 0;
  pFVar4 = (FState *)0x0;
  uStack_38 = in_RAX;
  while( true ) {
    bVar1 = (int)lVar5 < numnames;
    if ((this_00 == (FStateLabels *)0x0) || (numnames <= (int)lVar5)) goto LAB_004dc196;
    uStack_38 = CONCAT44(names[lVar5].Index,(undefined4)uStack_38);
    pFVar2 = FStateLabels::FindLabel(this_00,(FName *)((long)&uStack_38 + 4));
    if (pFVar2 == (FStateLabel *)0x0) break;
    pFVar4 = pFVar2->State;
    this_00 = pFVar2->Children;
    lVar5 = lVar5 + 1;
  }
  bVar1 = true;
LAB_004dc196:
  pFVar3 = (FState *)0x0;
  if (!exact) {
    pFVar3 = pFVar4;
  }
  if (!bVar1) {
    pFVar3 = pFVar4;
  }
  return pFVar3;
}

Assistant:

FState *PClassActor::FindState(int numnames, FName *names, bool exact) const
{
	FStateLabels *labels = StateList;
	FState *best = NULL;

	if (labels != NULL)
	{
		int count = 0;
		FStateLabel *slabel = NULL;
		FName label;

		// Find the best-matching label for this class.
		while (labels != NULL && count < numnames)
		{
			label = *names++;
			slabel = labels->FindLabel(label);

			if (slabel != NULL)
			{
				count++;
				labels = slabel->Children;
				best = slabel->State;
			}
			else
			{
				break;
			}
		}
		if (count < numnames && exact)
		{
			return NULL;
		}
	}
	return best;
}